

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall
branch_and_reduce_algorithm::compute_fold
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *S,
          vector<int,_std::allocator<int>_> *NS)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  pointer piVar5;
  int *piVar6;
  pointer piVar7;
  _func_int **pp_Var8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar10;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  int *piVar13;
  pointer piVar14;
  int iVar15;
  const_iterator __begin1;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  vector<int,_std::allocator<int>_> *__range1_2;
  vector<int,_std::allocator<int>_> vs;
  vector<int,_std::allocator<int>_> removed;
  vector<int,_std::allocator<int>_> *__range1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  vector<int,_std::allocator<int>_> copyOfTmp;
  undefined1 local_f9;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  undefined1 local_98 [16];
  pointer local_88;
  
  lVar17 = (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
  if ((long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2 != (lVar17 >> 2) + 1) {
    __assert_fail("NS.size() == S.size() + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0xca,
                  "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,lVar17 >> 1,(allocator_type *)local_98);
  piVar16 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar21 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  uVar18 = (long)piVar21 - (long)piVar16 >> 2;
  if ((long)piVar21 - (long)piVar16 != 0) {
    uVar20 = 0;
    do {
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar20] = piVar16[uVar20];
      uVar20 = uVar20 + 1;
    } while ((uVar20 & 0xffffffff) < uVar18);
  }
  piVar13 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (piVar21 != piVar16) {
    uVar20 = 0;
    do {
      uVar22 = uVar20 + 1 & 0xffffffff;
      *(int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar20 * 4 + ((long)piVar21 - (long)piVar16)
              ) = piVar13[uVar22];
      uVar20 = uVar20 + 1;
    } while (uVar22 < uVar18);
  }
  iVar1 = *piVar13;
  iVar15 = (this->used).uid;
  iVar23 = iVar15 + 1;
  (this->used).uid = iVar23;
  if (iVar15 < -1) {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar17 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar14;
    if (lVar17 != 0) {
      uVar18 = 0;
      do {
        piVar14[uVar18] = 0;
        uVar18 = uVar18 + 1;
      } while ((uVar18 & 0xffffffff) < (ulong)(lVar17 >> 2));
    }
    (this->used).uid = 1;
    iVar23 = 1;
  }
  if (piVar21 != piVar16) {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar14[*piVar16] = iVar23;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar16 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  local_b8 = S;
  if (piVar13 == piVar16) {
    iVar23 = 0;
  }
  else {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar23 = 0;
    do {
      iVar15 = *piVar13;
      if (piVar14[iVar15] == (this->used).uid) {
        __assert_fail("!used.get(v)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                      ,0xdc,
                      "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                     );
      }
      piVar21 = pvVar4[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar4[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar21 != piVar6) {
        piVar7 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar15 = *piVar21;
          if ((piVar5[iVar15] < 0) &&
             (iVar2 = (this->used).uid, iVar3 = piVar14[iVar15], piVar14[iVar15] = iVar2,
             iVar3 != iVar2)) {
            lVar17 = (long)iVar23;
            iVar23 = iVar23 + 1;
            piVar7[lVar17] = iVar15;
          }
          piVar21 = piVar21 + 1;
        } while (piVar21 != piVar6);
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar16);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b0,(long)(iVar23 + 1),(allocator_type *)local_98);
  _Var19._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)local_98,_Var19,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var19._M_current + iVar23),(allocator_type *)&local_f8);
  pp_Var8 = (_func_int **)
            ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  piVar14 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
  ;
  piVar5 = ((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  *(undefined4 *)
   &((local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_start = local_98._0_4_;
  *(undefined4 *)
   ((long)&((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start +
   4) = local_98._4_4_;
  *(undefined4 *)
   &((local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
    _M_impl.super__Vector_impl_data._M_finish = local_98._8_4_;
  *(undefined4 *)
   ((long)&((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
   + 4) = local_98._12_4_;
  ((local_b0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
  local_98._0_8_ = pp_Var8;
  local_98._8_8_ = piVar14;
  local_88 = piVar5;
  if (pp_Var8 != (_func_int **)0x0) {
    operator_delete(pp_Var8,(long)piVar5 - (long)pp_Var8);
  }
  piVar14 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  piVar5 = ((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish;
  if (piVar14 != piVar5) {
    uVar18 = (long)piVar5 - (long)piVar14 >> 2;
    lVar17 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar14,piVar5,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar14,piVar5);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f8,(long)(iVar23 + 1),(allocator_type *)local_98);
  *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       iVar1;
  iVar15 = (this->used).uid;
  iVar23 = iVar15 + 1;
  (this->used).uid = iVar23;
  if (iVar15 < -1) {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar17 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar14;
    if (lVar17 != 0) {
      uVar18 = 0;
      do {
        piVar14[uVar18] = 0;
        uVar18 = uVar18 + 1;
      } while ((uVar18 & 0xffffffff) < (ulong)(lVar17 >> 2));
    }
    (this->used).uid = 1;
    iVar23 = 1;
  }
  piVar16 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar21 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar16 != piVar21) {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar14[*piVar16] = iVar23;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar16 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar21 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if (piVar16 != piVar21) {
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar14[*piVar16] = iVar23;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar14 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  if (((local_b0.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_finish != piVar14) {
    uVar18 = 0;
    do {
      iVar23 = piVar14[uVar18];
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var19._M_current =
           (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      piVar16 = pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar21 = *(pointer *)
                 ((long)&pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      if (piVar16 == piVar21) {
        iVar15 = 0;
LAB_00109a1a:
        lVar17 = (long)iVar15;
        iVar15 = iVar15 + 1;
        _Var19._M_current[lVar17] = iVar1;
      }
      else {
        piVar14 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = 0;
        bVar10 = false;
        do {
          iVar2 = *piVar16;
          if ((piVar14[iVar2] < 0) && (piVar5[iVar2] != (this->used).uid)) {
            if ((!bVar10) && (iVar1 < iVar2)) {
              lVar17 = (long)iVar15;
              iVar15 = iVar15 + 1;
              _Var19._M_current[lVar17] = iVar1;
              bVar10 = true;
            }
            lVar17 = (long)iVar15;
            iVar15 = iVar15 + 1;
            _Var19._M_current[lVar17] = iVar2;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar21);
        _Var19._M_current =
             (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (!bVar10) goto LAB_00109a1a;
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar18] = iVar23;
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_98,_Var19,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (_Var19._M_current + iVar15),(allocator_type *)&local_c8);
      pp_Var8 = (_func_int **)
                local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar14 = local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar5 = local_b0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar18].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_98._0_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar18].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_98._8_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar18].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98._0_8_ = pp_Var8;
      local_98._8_8_ = piVar14;
      local_88 = piVar5;
      if (pp_Var8 != (_func_int **)0x0) {
        operator_delete(pp_Var8,(long)piVar5 - (long)pp_Var8);
      }
      piVar14 = ((local_b0.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar18 < (ulong)((long)((local_b0.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar14 >> 2));
  }
  fold::fold((fold *)local_98,
             (int)((ulong)((long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2),&local_e0,&local_f8,
             &local_b0,this);
  local_c8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fold,std::allocator<fold>,fold>
            (&_Stack_c0,(fold **)&local_c8,(allocator<fold> *)&local_f9,(fold *)local_98);
  _Var12._M_pi = _Stack_c0._M_pi;
  peVar11 = local_c8;
  iVar23 = this->modifiedN;
  this->modifiedN = iVar23 + 1;
  psVar9 = (this->modifieds).
           super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = psVar9[iVar23].super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  psVar9 = psVar9 + iVar23;
  (psVar9->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar11;
  (psVar9->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var12._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  modified::~modified((modified *)local_98);
  if (USE_DEPENDENCY_CHECKING == true) {
    if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar14 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar23 = *piVar14;
        ArraySet::Insert(&this->dc_candidates,iVar23);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar21 = *(pointer *)
                   ((long)&pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        for (piVar16 = pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar21; piVar16 = piVar16 + 1)
        {
          ArraySet::Insert(&this->dc_candidates,*piVar16);
        }
        piVar14 = piVar14 + 1;
      } while (piVar14 !=
               local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar14 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar23 = *piVar14;
        ArraySet::Insert(&this->dc_candidates,iVar23);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar21 = *(pointer *)
                   ((long)&pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        for (piVar16 = pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar21; piVar16 = piVar16 + 1)
        {
          ArraySet::Insert(&this->dc_candidates,*piVar16);
        }
        piVar14 = piVar14 + 1;
      } while (piVar14 !=
               local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::compute_fold(std::vector<int> const &S, std::vector<int> const &NS) {
    assert(NS.size() == S.size() + 1);

    // remove all vertices but the 1. neighbour
    std::vector<int> removed(S.size() * 2);
    for (unsigned int i = 0; i < S.size(); i++)
        removed[i] = S[i];
    for (unsigned int i = 0; i < S.size(); i++)
        removed[S.size() + i] = NS[1 + i];

    // s = first neighbour
    int s = NS[0];
    used.clear();
    for (int v : S)
        used.add(v);
    std::vector<int> &tmp = modTmp;
    int p = 0;
    for (int v : NS)
    {
        assert(!used.get(v));
        for (int u : adj[v])
            if (x[u] < 0 && used.add(u))
            {
                tmp[p++] = u;
            }
    }
    // tmp contains N(N(S))\S

    // set edges of s
    std::vector<std::vector<int>> newAdj(p + 1);
    {
        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
        newAdj[0].swap(copyOfTmp);
    }
    std::sort(newAdj[0].begin(), newAdj[0].end());
    std::vector<int> vs(p + 1);
    vs[0] = s;
    used.clear();
    for (int v : S)
        used.add(v);
    for (int v : NS)
        used.add(v);

    // set edges of vertices in tmp
    for (unsigned int i = 0; i < newAdj[0].size(); i++)
    {
        int v = newAdj[0][i];
        p = 0;
        bool add = false;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                if (!add && s < u)
                {
                    tmp[p++] = s;
                    add = true;
                }
                tmp[p++] = u;
            }
        if (!add)
            tmp[p++] = s;
        vs[1 + i] = v;

        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i + 1].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<fold>(fold(S.size(), removed, vs, newAdj, this));

    // dependency checking
    if (USE_DEPENDENCY_CHECKING) {
        for (int v : vs) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }

        for (int v : removed) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }
    }
}